

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O3

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  long lVar2;
  MessageType MVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pcVar7;
  cmake *pcVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  cmExecutionStatus status;
  string errorString;
  MessageType messType;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace bt;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_f4;
  string local_f0;
  cmExecutionStatus *local_d0;
  MessageType local_c4;
  Internals *local_c0;
  string local_b8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_98;
  undefined1 local_78 [72];
  
  iVar4 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"if");
  if (iVar4 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar4 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endif");
    if (iVar4 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        local_d0 = inStatus;
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_78,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        if ((Internals *)local_78._0_8_ == (Internals *)0x0) {
          return false;
        }
        local_c0 = (Internals *)local_78._0_8_;
        local_f4.ReturnInvoked = false;
        local_f4.BreakInvoked = false;
        local_f4.ContinueInvoked = false;
        local_f4.NestedError = false;
        pcVar7 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->Functions).
            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar7) {
          iVar4 = 0;
          uVar9 = 0;
          uVar10 = 1;
          do {
            iVar5 = cmsys::SystemTools::Strucmp
                              (pcVar7[uVar9].super_cmListFileContext.Name._M_dataplus._M_p,"if");
            iVar6 = cmsys::SystemTools::Strucmp
                              ((this->Functions).
                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar9].
                               super_cmListFileContext.Name._M_dataplus._M_p,"endif");
            iVar4 = (iVar4 + (uint)(iVar5 == 0)) - (uint)(iVar6 == 0);
            if (iVar4 == 0) {
              iVar5 = cmsys::SystemTools::Strucmp
                                ((this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                 super_cmListFileContext.Name._M_dataplus._M_p,"else");
              if (iVar5 == 0) {
                bVar11 = this->HasRun;
                this->IsBlocking = bVar11;
                this->HasRun = true;
                if ((bVar11 == false) &&
                   (pcVar8 = cmMakefile::GetCMakeInstance(mf), pcVar8->Trace == true)) {
                  cmMakefile::PrintCommandTrace
                            (mf,(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar9);
                }
              }
              else {
                iVar5 = cmsys::SystemTools::Strucmp
                                  ((this->Functions).
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                   super_cmListFileContext.Name._M_dataplus._M_p,"elseif");
                if (iVar5 != 0) goto LAB_003defb9;
                if (this->HasRun == true) {
                  this->IsBlocking = true;
                }
                else {
                  pcVar8 = cmMakefile::GetCMakeInstance(mf);
                  if (pcVar8->Trace == true) {
                    cmMakefile::PrintCommandTrace
                              (mf,(this->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar9);
                  }
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  local_f0._M_string_length = 0;
                  local_f0.field_2._M_local_buf[0] = '\0';
                  local_98.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_98.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_98.
                  super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  cmMakefile::ExpandArguments
                            (mf,&(this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar9].Arguments,
                             &local_98,(char *)0x0);
                  cmConditionEvaluator::cmConditionEvaluator
                            ((cmConditionEvaluator *)(local_78 + 0x30),mf);
                  bVar11 = cmConditionEvaluator::IsTrue
                                     ((cmConditionEvaluator *)(local_78 + 0x30),&local_98,&local_f0,
                                      &local_c4);
                  if (local_f0._M_string_length != 0) {
                    cmIfCommandError_abi_cxx11_(&local_b8,&local_98);
                    std::__cxx11::string::_M_append
                              ((char *)&local_b8,(ulong)local_f0._M_dataplus._M_p);
                    cmMakefile::GetBacktrace
                              ((cmListFileBacktrace *)local_78,mf,
                               &(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar9].
                                super_cmListFileContext);
                    pcVar8 = cmMakefile::GetCMakeInstance(mf);
                    MVar3 = local_c4;
                    cmake::IssueMessage(pcVar8,local_c4,&local_b8,(cmListFileBacktrace *)local_78);
                    if (MVar3 == FATAL_ERROR) {
                      cmSystemTools::s_FatalErrorOccured = true;
                      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                                 local_78);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                        operator_delete(local_b8._M_dataplus._M_p,
                                        local_b8.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ::~vector(&local_98);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p,
                                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                                 local_f0.field_2._M_local_buf[0]) + 1);
                      }
                      break;
                    }
                    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                               local_78);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                      operator_delete(local_b8._M_dataplus._M_p,
                                      local_b8.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (bVar11) {
                    this->IsBlocking = false;
                    this->HasRun = true;
                  }
                  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  ::~vector(&local_98);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                             local_f0.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
            }
            else {
LAB_003defb9:
              if (this->IsBlocking == false) {
                local_f4.ReturnInvoked = false;
                local_f4.BreakInvoked = false;
                local_f4.ContinueInvoked = false;
                local_f4.NestedError = false;
                cmMakefile::ExecuteCommand
                          (mf,(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar9,&local_f4);
                if (local_f4.ReturnInvoked == true) {
                  local_d0->ReturnInvoked = true;
                  break;
                }
                if (local_f4.BreakInvoked == true) {
                  local_d0->BreakInvoked = true;
                  break;
                }
                if (local_f4.ContinueInvoked == true) {
                  local_d0->ContinueInvoked = true;
                  break;
                }
              }
            }
            pcVar7 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar9 = ((long)(this->Functions).
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar7 >> 5) *
                    -0x5555555555555555;
            bVar11 = uVar10 <= uVar9;
            lVar2 = uVar9 - uVar10;
            uVar9 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar11 && lVar2 != 0);
        }
        (*(code *)*(_List_node_base **)
                   ((long)((local_c0->VarStack).
                           super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                           _M_node.super__List_node_base._M_next + 1) + 8))();
        return true;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmConditionEvaluator conditionEvaluator(mf);

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}